

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field_inl.h
# Opt level: O3

void __thiscall
google::protobuf::internal::
TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapBegin
          (TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this,
          MapIterator *map_iter)

{
  undefined4 *puVar1;
  int iVar2;
  undefined4 extraout_var;
  iterator_base<const_google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>
  local_30;
  
  iVar2 = (*(this->super_MapFieldBase)._vptr_MapFieldBase[0x15])();
  local_30.m_ = (InnerMap *)CONCAT44(extraout_var,iVar2);
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
  iterator_base<const_google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>
  ::SearchFrom(&local_30,(local_30.m_)->index_of_first_non_null_);
  puVar1 = (undefined4 *)map_iter->iter_;
  *(size_type *)(puVar1 + 4) = local_30.bucket_index_;
  *puVar1 = local_30.node_._0_4_;
  puVar1[1] = local_30.node_._4_4_;
  puVar1[2] = local_30.m_._0_4_;
  puVar1[3] = local_30.m_._4_4_;
  (*(this->super_MapFieldBase)._vptr_MapFieldBase[0x17])(this,map_iter);
  return;
}

Assistant:

void TypeDefinedMapFieldBase<Key, T>::MapBegin(MapIterator* map_iter) const {
  InternalGetIterator(map_iter) = GetMap().begin();
  SetMapIteratorValue(map_iter);
}